

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

double __thiscall userinfo_t::GetAimDist(userinfo_t *this)

{
  float fVar1;
  FBaseCVar **ppFVar2;
  double dVar3;
  double dVar4;
  undefined8 uStack_8;
  
  dVar3 = 0.0;
  if ((dmflags2.Value._2_1_ & 0x80) == 0) {
    uStack_8 = 0x1ec009a9fc0;
    ppFVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::CheckKey
                        (&this->
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         ,(FName *)((long)&uStack_8 + 4));
    fVar1 = *(float *)&(*ppFVar2)[1]._vptr_FBaseCVar;
    dVar4 = 35.0;
    if (0.0 <= fVar1) {
      dVar4 = (double)fVar1;
    }
    dVar3 = 35.0;
    if (fVar1 <= 35.0) {
      dVar3 = dVar4;
    }
  }
  return dVar3;
}

Assistant:

inline operator int () const { return Value; }